

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

bb_insn_t_conflict create_bb_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,bb_t_conflict bb)

{
  uint uVar1;
  bb_insn_t_conflict pbVar2;
  bitmap_t pVVar3;
  bitmap_el_t *pbVar4;
  
  pbVar2 = (bb_insn_t_conflict)malloc(0x58);
  if (pbVar2 == (bb_insn_t_conflict)0x0) {
    util_error(gen_ctx,"no memory");
  }
  insn->data = pbVar2;
  pbVar2->bb = bb;
  pbVar2->insn = insn;
  pbVar2->gvn_val_const_p = '\0';
  pbVar2->alloca_flag = (*(int *)&insn->field_0x18 == 0xad) * '\x03';
  pbVar2->call_hard_reg_args = (bitmap_t)0x0;
  uVar1 = gen_ctx->curr_cfg->curr_bb_insn_index;
  if ((ulong)uVar1 != 0xffffffff) {
    gen_ctx->curr_cfg->curr_bb_insn_index = uVar1 + 1;
    pbVar2->index = uVar1;
    pbVar2->mem_index = 0;
    pbVar2->gvn_val = (ulong)uVar1;
    (pbVar2->insn_dead_vars).head = (dead_var_t_conflict)0x0;
    (pbVar2->insn_dead_vars).tail = (dead_var_t_conflict)0x0;
    if (0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) {
      pVVar3 = (bitmap_t)malloc(0x18);
      pVVar3->els_num = 0;
      pVVar3->size = 1;
      pbVar4 = (bitmap_el_t *)malloc(8);
      pVVar3->varr = pbVar4;
      pbVar2->call_hard_reg_args = pVVar3;
    }
    pbVar2->label_disp = 0;
    return pbVar2;
  }
  __assert_fail("gen_ctx->curr_cfg->curr_bb_insn_index != (uint32_t) ~0ull",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x25f,"bb_insn_t create_bb_insn(gen_ctx_t, MIR_insn_t, bb_t)");
}

Assistant:

static bb_insn_t create_bb_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, bb_t bb) {
  bb_insn_t bb_insn = gen_malloc (gen_ctx, sizeof (struct bb_insn));

  insn->data = bb_insn;
  bb_insn->bb = bb;
  bb_insn->insn = insn;
  bb_insn->gvn_val_const_p = FALSE;
  bb_insn->alloca_flag = insn->code == MIR_ALLOCA ? MAY_ALLOCA | MUST_ALLOCA : 0;
  bb_insn->call_hard_reg_args = NULL;
  gen_assert (curr_cfg->curr_bb_insn_index != (uint32_t) ~0ull);
  bb_insn->index = curr_cfg->curr_bb_insn_index++;
  bb_insn->mem_index = 0;
  bb_insn->gvn_val = bb_insn->index;
  DLIST_INIT (dead_var_t, bb_insn->insn_dead_vars);
  if (MIR_call_code_p (insn->code)) bb_insn->call_hard_reg_args = bitmap_create2 (MAX_HARD_REG + 1);
  bb_insn->label_disp = 0;
  return bb_insn;
}